

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::LineStripRenderer<ImPlot::GetterXsYs<short>,_ImPlot::TransformerLogLog>::operator()
          (LineStripRenderer<ImPlot::GetterXsYs<short>,_ImPlot::TransformerLogLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  short sVar6;
  ImU32 IVar7;
  uint uVar8;
  GetterXsYs<short> *pGVar9;
  TransformerLogLog *pTVar10;
  ImPlotPlot *pIVar11;
  ImDrawVert *pIVar12;
  ImDrawVert *pIVar13;
  ImDrawIdx *pIVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [12];
  ImPlotContext *pIVar19;
  int iVar20;
  long lVar21;
  ImDrawIdx IVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  
  pIVar19 = GImPlot;
  pGVar9 = this->Getter;
  pTVar10 = this->Transformer;
  iVar20 = pGVar9->Count;
  lVar21 = (long)(((pGVar9->Offset + prim + 1) % iVar20 + iVar20) % iVar20) * (long)pGVar9->Stride;
  sVar6 = *(short *)((long)pGVar9->Ys + lVar21);
  dVar15 = log10((double)(int)*(short *)((long)pGVar9->Xs + lVar21) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar11 = pIVar19->CurrentPlot;
  dVar1 = pIVar19->LogDenX;
  dVar2 = (pIVar11->XAxis).Range.Min;
  dVar3 = (pIVar11->XAxis).Range.Max;
  dVar16 = log10((double)(int)sVar6 / pIVar11->YAxis[pTVar10->YAxis].Range.Min);
  iVar20 = pTVar10->YAxis;
  pIVar11 = pIVar19->CurrentPlot;
  auVar27._8_8_ = dVar16;
  auVar27._0_8_ = dVar15;
  auVar28._8_4_ = SUB84(pIVar19->LogDenY[iVar20],0);
  auVar28._0_8_ = dVar1;
  auVar28._12_4_ = (int)((ulong)pIVar19->LogDenY[iVar20] >> 0x20);
  auVar28 = divpd(auVar27,auVar28);
  dVar1 = pIVar11->YAxis[iVar20].Range.Min;
  IVar4 = pIVar19->PixelRange[iVar20].Min;
  fVar23 = (float)(pIVar19->Mx *
                   (((double)(float)auVar28._0_8_ * (dVar3 - dVar2) + dVar2) -
                   (pIVar11->XAxis).Range.Min) + (double)IVar4.x);
  fVar24 = (float)(pIVar19->My[iVar20] *
                   (((double)(float)auVar28._8_8_ * (pIVar11->YAxis[iVar20].Range.Max - dVar1) +
                    dVar1) - dVar1) + (double)IVar4.y);
  fVar25 = (this->P1).x;
  fVar26 = (this->P1).y;
  auVar32._0_4_ = ~-(uint)(fVar23 <= fVar25) & (uint)fVar23;
  auVar32._4_4_ = ~-(uint)(fVar24 <= fVar26) & (uint)fVar24;
  auVar32._8_4_ = ~-(uint)(fVar25 < fVar23) & (uint)fVar23;
  auVar32._12_4_ = ~-(uint)(fVar26 < fVar24) & (uint)fVar24;
  auVar17._4_4_ = (uint)fVar26 & -(uint)(fVar24 <= fVar26);
  auVar17._0_4_ = (uint)fVar25 & -(uint)(fVar23 <= fVar25);
  auVar17._8_4_ = (uint)fVar25 & -(uint)(fVar25 < fVar23);
  auVar17._12_4_ = (uint)fVar26 & -(uint)(fVar26 < fVar24);
  auVar32 = auVar32 | auVar17;
  fVar29 = (cull_rect->Min).y;
  auVar18._4_8_ = auVar32._8_8_;
  auVar18._0_4_ = -(uint)(auVar32._4_4_ < fVar29);
  auVar33._0_8_ = auVar18._0_8_ << 0x20;
  auVar33._8_4_ = -(uint)(auVar32._8_4_ < (cull_rect->Max).x);
  auVar33._12_4_ = -(uint)(auVar32._12_4_ < (cull_rect->Max).y);
  auVar34._4_4_ = -(uint)(fVar29 < auVar32._4_4_);
  auVar34._0_4_ = -(uint)((cull_rect->Min).x < auVar32._0_4_);
  auVar34._8_8_ = auVar33._8_8_;
  iVar20 = movmskps((int)pIVar11,auVar34);
  if (iVar20 == 0xf) {
    IVar7 = this->Col;
    IVar4 = *uv;
    fVar29 = fVar23 - fVar25;
    fVar30 = fVar24 - fVar26;
    fVar31 = fVar29 * fVar29 + fVar30 * fVar30;
    if (0.0 < fVar31) {
      fVar31 = 1.0 / SQRT(fVar31);
      fVar29 = fVar29 * fVar31;
      fVar30 = fVar30 * fVar31;
    }
    fVar31 = this->Weight * 0.5;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12->uv = IVar4;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13->col = IVar7;
    fVar29 = fVar31 * fVar29;
    fVar31 = fVar31 * fVar30;
    (pIVar12->pos).x = fVar25 + fVar31;
    (pIVar12->pos).y = fVar26 - fVar29;
    pIVar13[1].pos.x = fVar31 + fVar23;
    pIVar13[1].pos.y = fVar24 - fVar29;
    pIVar13[1].uv = IVar4;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[1].col = IVar7;
    pIVar12[2].pos.x = fVar23 - fVar31;
    pIVar12[2].pos.y = fVar29 + fVar24;
    pIVar12[2].uv = IVar4;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[2].col = IVar7;
    IVar5 = this->P1;
    pIVar12[3].pos.x = IVar5.x - fVar31;
    pIVar12[3].pos.y = IVar5.y + fVar29;
    pIVar12[3].uv.x = IVar4.x;
    pIVar12[3].uv.y = IVar4.y;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[3].col = IVar7;
    DrawList->_VtxWritePtr = pIVar12 + 4;
    uVar8 = DrawList->_VtxCurrentIdx;
    pIVar14 = DrawList->_IdxWritePtr;
    IVar22 = (ImDrawIdx)uVar8;
    *pIVar14 = IVar22;
    pIVar14[1] = IVar22 + 1;
    pIVar14[2] = IVar22 + 2;
    pIVar14[3] = IVar22;
    pIVar14[4] = IVar22 + 2;
    pIVar14[5] = IVar22 + 3;
    DrawList->_IdxWritePtr = pIVar14 + 6;
    DrawList->_VtxCurrentIdx = uVar8 + 4;
  }
  IVar4.y = fVar24;
  IVar4.x = fVar23;
  this->P1 = IVar4;
  return (char)iVar20 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        P1 = P2;
        return true;
    }